

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O3

void __thiscall
UnscentedKalmanFilter::UnscentedKalmanFilter(UnscentedKalmanFilter *this,UKFParameters *p)

{
  VectorXd *_other;
  VectorXd *this_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  DenseIndex DVar6;
  double *pdVar7;
  ulong uVar8;
  double dVar9;
  DenseIndex DVar10;
  Index size;
  ostream *poVar11;
  undefined8 *puVar12;
  Index index;
  long lVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  double dVar17;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  
  this->_vptr_UnscentedKalmanFilter = (_func_int **)&PTR__UnscentedKalmanFilter_0014fd00;
  dVar9 = p->std_yawdd;
  this->std_a_ = p->std_a;
  this->std_yawdd_ = dVar9;
  this->pred_rate_ = p->pred_rate;
  this->debug_ = p->debug;
  iVar3 = p->k;
  this->type_ = p->type;
  this->k_ = iVar3;
  this->alpha_ = p->alpha;
  this->beta_ = p->beta;
  this->n_x_ = 5;
  this->n_aug_ = 7;
  this->n_sigma_ = 0xf;
  this->restart_ = false;
  this->is_initialized_ = false;
  this->previous_measurement_ = (Measurement *)0x0;
  this->current_sensor_ = (Sensor *)0x0;
  (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  (this->weights_c_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  (this->weights_c_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&local_48,5,5,1);
  pdVar5 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       local_48.m_data;
  DVar6 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
  ;
  (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       local_48.m_rows;
  local_48.m_data = pdVar5;
  local_48.m_rows = DVar6;
  free(pdVar5);
  local_48.m_data = (double *)0x0;
  local_48.m_rows = 0;
  local_48.m_cols = 0;
  lVar13 = (long)this->n_x_;
  if (-1 < lVar13) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_48,lVar13 * lVar13,lVar13,lVar13);
    pdVar5 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data;
    (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         local_48.m_data;
    DVar6 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows;
    DVar10 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols;
    (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
         local_48.m_rows;
    (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         local_48.m_cols;
    local_48.m_data = pdVar5;
    local_48.m_rows = DVar6;
    local_48.m_cols = DVar10;
    free(pdVar5);
    local_48.m_data = (double *)0x0;
    local_48.m_rows = 0;
    local_48.m_cols = 0;
    uVar1 = this->n_x_;
    lVar15 = (long)(int)uVar1;
    uVar2 = this->n_sigma_;
    lVar13 = (long)(int)uVar2;
    if (-1 < (int)(uVar2 | uVar1)) {
      if ((uVar2 != 0 && uVar1 != 0) &&
         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar13),0) < lVar15))
      {
        puVar12 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar12 = operator_delete;
        __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_48,lVar13 * lVar15,lVar15,lVar13);
      _other = &this->weights_m_;
      this_00 = &this->weights_c_;
      pdVar5 = (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data;
      (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_data = local_48.m_data;
      DVar6 = (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_rows;
      DVar10 = (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_cols;
      (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_rows = local_48.m_rows;
      (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols = local_48.m_cols;
      local_48.m_data = pdVar5;
      local_48.m_rows = DVar6;
      local_48.m_cols = DVar10;
      free(pdVar5);
      if (this->type_ == UKFScaled) {
        this->lambda_ =
             (double)(this->k_ + this->n_aug_) * this->alpha_ * this->alpha_ - (double)this->n_aug_;
        iVar3 = this->n_sigma_;
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                  ((DenseStorage<double,__1,__1,_1,_0> *)&local_48,(long)iVar3,(long)iVar3,1);
        if (-1 < iVar3) {
          pdVar5 = (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   .m_storage.m_data;
          (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_data = local_48.m_data;
          DVar6 = (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows;
          (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows = local_48.m_rows;
          local_48.m_data = pdVar5;
          local_48.m_rows = DVar6;
          free(pdVar5);
          iVar3 = this->n_sigma_;
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                    ((DenseStorage<double,__1,__1,_1,_0> *)&local_48,(long)iVar3,(long)iVar3,1);
          if (-1 < iVar3) {
            pdVar5 = (this->weights_c_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            ;
            (this->weights_c_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_data = local_48.m_data;
            DVar6 = (this->weights_c_).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
            (this->weights_c_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows = local_48.m_rows;
            local_48.m_data = pdVar5;
            local_48.m_rows = DVar6;
            free(pdVar5);
            lVar13 = (this->weights_m_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            ;
            if (0 < lVar13) {
              pdVar5 = (this->weights_m_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data;
              dVar9 = (double)this->n_aug_;
              *pdVar5 = this->lambda_ / (this->lambda_ + dVar9);
              lVar15 = (this->weights_c_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows;
              if (0 < lVar15) {
                pdVar7 = (this->weights_c_).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data;
                *pdVar7 = (double)this->beta_ + (1.0 - this->alpha_ * this->alpha_) +
                          this->lambda_ / (this->lambda_ + dVar9);
                iVar3 = this->n_sigma_;
                if (1 < (long)iVar3) {
                  lVar16 = 1;
                  do {
                    if (lVar15 == lVar16) goto LAB_0011b1b3;
                    dVar17 = 0.5 / (this->lambda_ + dVar9);
                    pdVar7[lVar16] = dVar17;
                    if (lVar13 == lVar16) goto LAB_0011b1b3;
                    pdVar5[lVar16] = dVar17;
                    lVar16 = lVar16 + 1;
                  } while (iVar3 != lVar16);
                }
                goto LAB_0011b0f4;
              }
            }
            goto LAB_0011b1b3;
          }
        }
      }
      else {
        this->lambda_ = (double)(this->k_ - this->n_aug_);
        iVar3 = this->n_sigma_;
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                  ((DenseStorage<double,__1,__1,_1,_0> *)&local_48,(long)iVar3,(long)iVar3,1);
        if (-1 < iVar3) {
          pdVar5 = (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   .m_storage.m_data;
          (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_data = local_48.m_data;
          DVar6 = (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows;
          (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows = local_48.m_rows;
          local_48.m_data = pdVar5;
          local_48.m_rows = DVar6;
          free(pdVar5);
          lVar13 = (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   .m_storage.m_rows;
          if (0 < lVar13) {
            pdVar5 = (this->weights_m_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            ;
            iVar3 = this->n_aug_;
            *pdVar5 = this->lambda_ / (this->lambda_ + (double)iVar3);
            iVar4 = this->n_sigma_;
            if (1 < (long)iVar4) {
              lVar15 = 1;
              do {
                if (lVar13 == lVar15) goto LAB_0011b1b3;
                pdVar5[lVar15] = 0.5 / (this->lambda_ + (double)iVar3);
                lVar15 = lVar15 + 1;
              } while (iVar4 != lVar15);
            }
            Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
            resizeLike<Eigen::Matrix<double,_1,1,0,_1,1>>
                      ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this_00,
                       (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)_other);
            uVar8 = (this->weights_c_).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
            if (uVar8 != (this->weights_m_).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_rows) {
              __assert_fail("rows() == other.rows() && cols() == other.cols()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Assign.h"
                            ,0x1f9,
                            "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
                           );
            }
            uVar14 = uVar8 - ((long)uVar8 >> 0x3f) & 0xfffffffffffffffe;
            if (1 < (long)uVar8) {
              lVar13 = 0;
              do {
                pdVar5 = (_other->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data + lVar13;
                dVar9 = pdVar5[1];
                pdVar7 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data + lVar13;
                *pdVar7 = *pdVar5;
                pdVar7[1] = dVar9;
                lVar13 = lVar13 + 2;
              } while (lVar13 < (long)uVar14);
            }
            if ((long)uVar14 < (long)uVar8) {
              pdVar5 = (_other->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data;
              pdVar7 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data;
              do {
                pdVar7[uVar14] = pdVar5[uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar8 != uVar14);
            }
LAB_0011b0f4:
            if (0 < this->debug_) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Weights m:\n",0xb);
              local_48.m_data = (double *)_other;
              poVar11 = Eigen::operator<<((ostream *)&std::cout,
                                          (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                           *)&local_48);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              std::ostream::put((char)poVar11);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Weights c:\n",0xb);
              local_48.m_data = (double *)this_00;
              poVar11 = Eigen::operator<<((ostream *)&std::cout,
                                          (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                           *)&local_48);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              std::ostream::put((char)poVar11);
              std::ostream::flush();
            }
            return;
          }
LAB_0011b1b3:
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x18a,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
      }
      __assert_fail("dim >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Matrix.h"
                    ,0xf0,
                    "Eigen::Matrix<double, -1, 1>::Matrix(Index) [_Scalar = double, _Rows = -1, _Cols = 1, _Options = 0, _MaxRows = -1, _MaxCols = 1]"
                   );
    }
  }
  local_48.m_cols = 0;
  local_48.m_rows = 0;
  local_48.m_data = (double *)0x0;
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/PlainObjectBase.h"
                ,0xf1,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

UnscentedKalmanFilter::UnscentedKalmanFilter(const UnscentedKalmanFilter::UKFParameters &p) :
    std_a_(p.std_a),
    std_yawdd_(p.std_yawdd),
    debug_(p.debug),
    pred_rate_(p.pred_rate),
    type_(p.type),
    k_(p.k),
    alpha_(p.alpha),
    beta_(p.beta),

    n_x_(5),
    n_aug_(n_x_+2),
    n_sigma_(2*n_aug_+1),

    restart_(false),
    is_initialized_(false),

    previous_measurement_(0),
    current_sensor_(0)
{
  // initial state vector
  x_ = VectorXd(n_x_);

  // initial covariance matrix
  P_ = MatrixXd(n_x_, n_x_);

  Xsig_pred_ = MatrixXd(n_x_, n_sigma_); 

  if (type_ != UKFScaled) {
  
      // set weights for classic style of UKF

      lambda_ = k_ - n_aug_;

      weights_m_ = VectorXd(n_sigma_);
      
      weights_m_(0)= lambda_ / (lambda_+n_aug_);
      
      for (int i=1; i<n_sigma_; i++) {  //2n+1 weights
          weights_m_(i) = .5/(n_aug_+lambda_);
      }

      weights_c_ = weights_m_;

  } else {

      // set weights for scaled type of UKF

      lambda_ = alpha_*alpha_*(n_aug_+k_) - n_aug_;
  
      weights_m_ = VectorXd(n_sigma_);
      weights_c_ = VectorXd(n_sigma_);

      weights_m_(0) = lambda_/(lambda_+n_aug_);
      weights_c_(0) = lambda_/(lambda_+n_aug_) + (1-alpha_*alpha_ + beta_);

      for (int i=1; i<n_sigma_; i++) {  // 2n+1 weights
          weights_m_(i) = weights_c_(i) = .5/(n_aug_+lambda_);
      }
  }

  if (debug_ > 0) { 
      std::cout << "Weights m:\n" << weights_m_.transpose() << std::endl;
      std::cout << "Weights c:\n" << weights_c_.transpose() << std::endl;
  }
}